

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AggressivePlayerStrategy.cpp
# Opt level: O1

void __thiscall
AggressivePlayerStrategy::execute(AggressivePlayerStrategy *this,Game *game,Player *player)

{
  bool bVar1;
  int iVar2;
  Map *pMVar3;
  string *psVar4;
  ostream *poVar5;
  _Alloc_hider _Var6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  string choice;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  Player::rollAggressive(player);
  Game::resolvePlayer(game,player,false);
  iVar2 = Player::getLifePoints(player);
  if (iVar2 < 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Player : ",9);
    psVar4 = Player::getPlayerName_abi_cxx11_(player);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(psVar4->_M_dataplus)._M_p,psVar4->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," died while resolving dice",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    return;
  }
  iVar2 = Player::getZone(player);
  if ((iVar2 < 1) || (iVar2 = Player::getZone(player), 6 < iVar2)) {
    pMVar3 = Game::getGameMap(game);
    bVar1 = Map::isManhattanEmpty(pMVar3);
    if (bVar1) {
      Player::setPhase(player,Move);
      iVar2 = Game::getNumberOfPlayers(game);
      if (iVar2 < 5) {
        Player::setZone(player,1);
        pMVar3 = Game::getGameMap(game);
        Map::setRegionOwner(pMVar3,1,player);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Player : ",9);
        psVar4 = Player::getPlayerName_abi_cxx11_(player);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(psVar4->_M_dataplus)._M_p,
                            psVar4->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," is in : ",9);
        Player::getZoneName_abi_cxx11_(&local_b0,player);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_b0._M_dataplus._M_p,local_b0._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
      }
      else {
        Player::setZone(player,4);
        pMVar3 = Game::getGameMap(game);
        Map::setRegionOwner(pMVar3,4,player);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Player : ",9);
        psVar4 = Player::getPlayerName_abi_cxx11_(player);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(psVar4->_M_dataplus)._M_p,
                            psVar4->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," is in : ",9);
        Player::getZoneName_abi_cxx11_(&local_b0,player);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_b0._M_dataplus._M_p,local_b0._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p == &local_b0.field_2) goto LAB_00119801;
      goto LAB_001197f4;
    }
    pMVar3 = Game::getGameMap(game);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"aggressive","");
    Map::moveComputer(pMVar3,player,&local_90);
    _Var6._M_p = local_90._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == &local_90.field_2) goto LAB_00119801;
  }
  else {
    Player::setPhase(player,Move);
    local_b0._M_string_length = 0;
    local_b0.field_2._M_local_buf[0] = '\0';
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    iVar2 = Player::getZone(player);
    if (iVar2 == 1) {
      iVar2 = 2;
      Player::setZone(player,2);
      pMVar3 = Game::getGameMap(game);
LAB_001197dd:
      Map::setRegionOwner(pMVar3,iVar2,player);
    }
    else {
      iVar2 = Player::getZone(player);
      if (iVar2 == 2) {
        iVar2 = 3;
        Player::setZone(player,3);
        pMVar3 = Game::getGameMap(game);
        goto LAB_001197dd;
      }
      iVar2 = Player::getZone(player);
      if (iVar2 != 3) {
        iVar2 = Player::getZone(player);
        if (iVar2 == 4) {
          iVar2 = 5;
          Player::setZone(player,5);
          pMVar3 = Game::getGameMap(game);
        }
        else {
          iVar2 = Player::getZone(player);
          if (iVar2 != 5) {
            iVar2 = Player::getZone(player);
            if (iVar2 == 6) {
              pMVar3 = Game::getGameMap(game);
              paVar7 = &local_70.field_2;
              local_70._M_dataplus._M_p = (pointer)paVar7;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"aggressive","");
              Map::moveComputer(pMVar3,player,&local_70);
              _Var6._M_p = local_70._M_dataplus._M_p;
              goto LAB_0011986c;
            }
            goto LAB_001197ea;
          }
          iVar2 = 6;
          Player::setZone(player,6);
          pMVar3 = Game::getGameMap(game);
        }
        goto LAB_001197dd;
      }
      pMVar3 = Game::getGameMap(game);
      paVar7 = &local_50.field_2;
      local_50._M_dataplus._M_p = (pointer)paVar7;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"outmanhattan","");
      Map::moveComputer(pMVar3,player,&local_50);
      _Var6._M_p = local_50._M_dataplus._M_p;
LAB_0011986c:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var6._M_p != paVar7) {
        operator_delete(_Var6._M_p,paVar7->_M_allocated_capacity + 1);
      }
    }
LAB_001197ea:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p == &local_b0.field_2) goto LAB_00119801;
LAB_001197f4:
    local_90.field_2._M_allocated_capacity =
         CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,local_b0.field_2._M_local_buf[0]);
    _Var6._M_p = local_b0._M_dataplus._M_p;
  }
  operator_delete(_Var6._M_p,local_90.field_2._M_allocated_capacity + 1);
LAB_00119801:
  Game::buyCardsComputer(game,player);
  return;
}

Assistant:

void AggressivePlayerStrategy::execute(Game *game, Player *player) {

    /*
		The aggressive player strategy will have this player profile:
			- During dice rolls : Will reroll anything that is not Destruction or Attack.
			- Resolve dices : Will just resolve in whatever order the dices are returned.
			- Move : Will always try to get out off manhattan whenever he has the occasion, if not in manhattan will stay same position.
			- Buy cards: Will always try to buy a card.
	*/

    player->rollAggressive();
    // resolve the dice (mandatory) unordered
    game->resolvePlayer(player, false);

    if(player->getLifePoints() <= 0) {
        cout << "Player : " << player->getPlayerName() << " died while resolving dice" << endl;
        return;
    }
    // move

    // if player is in manhattan
    if(player->getZone()>0 && player->getZone()<7){
        player->setPhase(Player::Phase::Move);
        std::string choice;
        if(player->getZone() == 1) {  // Manhattan Lower 2-4
            player->setZone(2);
            game->getGameMap()->setRegionOwner(2, player);
        }
        else if(player->getZone() == 2) {  // Manhattan Midtown 2-4
            player->setZone(3);
            game->getGameMap()->setRegionOwner(3, player);
        }
        else if(player->getZone() == 3) {  // Manhattan Upper 2-4
                game->getGameMap()->moveComputer(player, "outmanhattan");
        }
        else if(player->getZone() == 4) {  // Manhattan Lower 5-6
            player->setZone(5);
            game->getGameMap()->setRegionOwner(5, player);
        }
        else if(player->getZone() == 5) {  // Manhattan Midtown 5-6
            player->setZone(6);
            game->getGameMap()->setRegionOwner(6, player);
        }
        else if(player->getZone() == 6) {  // Manhattan Upper 5-6

                game->getGameMap()->moveComputer(player, "aggressive");
        }


    }
    else { // Not in manhattan
        if(game->getGameMap()->isManhattanEmpty()){ // must move to manhattan if empty
            player->setPhase(Player::Phase::Move);
            if (game->getNumberOfPlayers() < 5){
                player->setZone(1);
                game->getGameMap()->setRegionOwner(1, player);
                cout << "Player : " << player->getPlayerName() << " is in : " << player->getZoneName() << endl;
            }
            else{
                player->setZone(4);
                game->getGameMap()->setRegionOwner(4, player);
                cout << "Player : " << player->getPlayerName() << " is in : " << player->getZoneName() << endl;
            }
        }
        else{ // there is atleast 1 player in manhattan
                game->getGameMap()->moveComputer(player, "aggressive");
        }

    }

    // buy cards (optional)
    game->buyCardsComputer(player);

}